

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

void __thiscall lunasvg::SVGMaskElement::applyMask(SVGMaskElement *this,SVGRenderState *state)

{
  float tx;
  float ty;
  __shared_count<(__gnu_cxx::_Lock_policy)2> parent;
  bool bVar1;
  Units UVar2;
  Transform *pTVar3;
  element_type *peVar4;
  SVGElement *element;
  SVGClipPathElement *pSVar5;
  SVGMaskElement *pSVar6;
  Canvas *this_00;
  Rect RVar7;
  float local_128;
  float fStack_124;
  shared_ptr<lunasvg::Canvas> local_e8;
  undefined1 local_d8 [8];
  SVGRenderState newState;
  Rect bbox;
  Transform currentTransform;
  Rect local_58;
  Rect local_48;
  Rect local_38;
  undefined1 local_28 [8];
  shared_ptr<lunasvg::Canvas> maskImage;
  SVGRenderState *state_local;
  SVGMaskElement *this_local;
  
  maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)state;
  bVar1 = SVGRenderState::hasCycleReference(state,&this->super_SVGElement);
  if (!bVar1) {
    pTVar3 = SVGRenderState::currentTransform
                       ((SVGRenderState *)
                        maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    RVar7 = SVGRenderState::paintBoundingBox
                      ((SVGRenderState *)
                       maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    local_48._0_8_ = RVar7._0_8_;
    local_48._8_8_ = RVar7._8_8_;
    RVar7 = Transform::mapRect(pTVar3,&local_48);
    local_38._0_8_ = RVar7._0_8_;
    local_38._8_8_ = RVar7._8_8_;
    Canvas::create((Canvas *)local_28,&local_38);
    peVar4 = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    element = SVGRenderState::element
                        ((SVGRenderState *)
                         maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    RVar7 = maskRect(this,element);
    local_58._8_8_ = RVar7._8_8_;
    local_128 = RVar7.x;
    fStack_124 = RVar7.y;
    local_58.x = local_128;
    local_58.y = fStack_124;
    pTVar3 = SVGRenderState::currentTransform
                       ((SVGRenderState *)
                        maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    Canvas::clipRect(peVar4,&local_58,NonZero,pTVar3);
    pTVar3 = SVGRenderState::currentTransform
                       ((SVGRenderState *)
                        maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    bbox.w = (pTVar3->m_matrix).a;
    bbox.h = (pTVar3->m_matrix).b;
    UVar2 = SVGEnumeration<lunasvg::Units>::value(&this->m_maskContentUnits);
    if (UVar2 == ObjectBoundingBox) {
      RVar7 = SVGRenderState::fillBoundingBox
                        ((SVGRenderState *)
                         maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
      bbox._0_8_ = RVar7._8_8_;
      newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_4_ = RVar7.x;
      tx = newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._0_4_;
      newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = RVar7.y;
      ty = newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_;
      newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = RVar7._0_8_;
      Transform::translate((Transform *)&bbox.w,tx,ty);
      Transform::scale((Transform *)&bbox.w,bbox.x,bbox.y);
    }
    parent._M_pi = maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    std::shared_ptr<lunasvg::Canvas>::shared_ptr(&local_e8,(shared_ptr<lunasvg::Canvas> *)local_28);
    SVGRenderState::SVGRenderState
              ((SVGRenderState *)local_d8,&this->super_SVGElement,(SVGRenderState *)parent._M_pi,
               (Transform *)&bbox.w,Painting,&local_e8);
    std::shared_ptr<lunasvg::Canvas>::~shared_ptr(&local_e8);
    SVGElement::renderChildren(&this->super_SVGElement,(SVGRenderState *)local_d8);
    pSVar5 = SVGElement::clipper(&this->super_SVGElement);
    if (pSVar5 != (SVGClipPathElement *)0x0) {
      pSVar5 = SVGElement::clipper(&this->super_SVGElement);
      SVGClipPathElement::applyClipMask(pSVar5,(SVGRenderState *)local_d8);
    }
    pSVar6 = SVGElement::masker(&this->super_SVGElement);
    if (pSVar6 != (SVGMaskElement *)0x0) {
      pSVar6 = SVGElement::masker(&this->super_SVGElement);
      applyMask(pSVar6,(SVGRenderState *)local_d8);
    }
    if (this->m_mask_type == Luminance) {
      peVar4 = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      Canvas::convertToLuminanceMask(peVar4);
    }
    this_00 = SVGRenderState::operator->
                        ((SVGRenderState *)
                         maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    peVar4 = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_28);
    Canvas::blendCanvas(this_00,peVar4,Dst_In,1.0);
    SVGRenderState::~SVGRenderState((SVGRenderState *)local_d8);
    std::shared_ptr<lunasvg::Canvas>::~shared_ptr((shared_ptr<lunasvg::Canvas> *)local_28);
  }
  return;
}

Assistant:

void SVGMaskElement::applyMask(SVGRenderState& state) const
{
    if(state.hasCycleReference(this))
        return;
    auto maskImage = Canvas::create(state.currentTransform().mapRect(state.paintBoundingBox()));
    maskImage->clipRect(maskRect(state.element()), FillRule::NonZero, state.currentTransform());

    auto currentTransform = state.currentTransform();
    if(m_maskContentUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        currentTransform.translate(bbox.x, bbox.y);
        currentTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, currentTransform, SVGRenderMode::Painting, maskImage);
    renderChildren(newState);
    if(clipper())
        clipper()->applyClipMask(newState);
    if(masker()) {
        masker()->applyMask(newState);
    }

    if(m_mask_type == MaskType::Luminance)
        maskImage->convertToLuminanceMask();
    state->blendCanvas(*maskImage, BlendMode::Dst_In, 1.f);
}